

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepairResponsePdu.cpp
# Opt level: O0

void __thiscall DIS::RepairResponsePdu::RepairResponsePdu(RepairResponsePdu *this)

{
  RepairResponsePdu *this_local;
  
  LogisticsFamilyPdu::LogisticsFamilyPdu(&this->super_LogisticsFamilyPdu);
  (this->super_LogisticsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__RepairResponsePdu_00272ea0;
  EntityID::EntityID(&this->_receivingEntityID);
  EntityID::EntityID(&this->_repairingEntityID);
  this->_repairResult = '\0';
  this->_padding1 = 0;
  this->_padding2 = '\0';
  Pdu::setPduType((Pdu *)this,'\n');
  return;
}

Assistant:

RepairResponsePdu::RepairResponsePdu() : LogisticsFamilyPdu(),
   _receivingEntityID(), 
   _repairingEntityID(), 
   _repairResult(0), 
   _padding1(0), 
   _padding2(0)
{
    setPduType( 10 );
}